

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_psraw_mips(uint64_t fs,uint64_t ft)

{
  uint local_24;
  uint64_t uStack_20;
  uint i;
  LMIValue vs;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vs.ub[0] = (uint8_t)(ft & 0x7f);
  if (0x1f < (ft & 0x7f)) {
    vs.ub[0] = '\x1f';
  }
  uStack_20 = fs;
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    *(int *)((long)&stack0xffffffffffffffe0 + (ulong)local_24 * 4) =
         *(int *)((long)&stack0xffffffffffffffe0 + (ulong)local_24 * 4) >> (vs.ub[0] & 0x1f);
  }
  return uStack_20;
}

Assistant:

uint64_t helper_psraw(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 31) {
        ft = 31;
    }
    vs.d = fs;
    for (i = 0; i < 2; ++i) {
        vs.sw[i] >>= ft;
    }
    return vs.d;
}